

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

size_t __thiscall CoreML::Specification::GRULayerParams::ByteSizeLong(GRULayerParams *this)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  Type *this_00;
  size_t sVar5;
  ulong uVar6;
  size_t sVar7;
  uint index;
  
  uVar4 = (this->activations_).super_RepeatedPtrFieldBase.current_size_;
  sVar7 = (size_t)uVar4;
  index = 0;
  if (sVar7 == 0) {
    sVar7 = 0;
  }
  else {
    do {
      this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::TypeHandler>
                          (&(this->activations_).super_RepeatedPtrFieldBase,index);
      sVar5 = ActivationParams::ByteSizeLong(this_00);
      uVar3 = (uint)sVar5 | 1;
      iVar1 = 0x1f;
      if (uVar3 != 0) {
        for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      sVar7 = sVar7 + sVar5 + (ulong)(iVar1 * 9 + 0x49U >> 6);
      index = index + 1;
    } while (uVar4 != index);
  }
  if (this != (GRULayerParams *)&_GRULayerParams_default_instance_ &&
      this->updategateweightmatrix_ != (WeightParams *)0x0) {
    sVar5 = WeightParams::ByteSizeLong(this->updategateweightmatrix_);
    uVar4 = (uint)sVar5 | 1;
    iVar1 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar7 = sVar7 + sVar5 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 2;
  }
  if (this->resetgateweightmatrix_ != (WeightParams *)0x0 &&
      this != (GRULayerParams *)&_GRULayerParams_default_instance_) {
    sVar5 = WeightParams::ByteSizeLong(this->resetgateweightmatrix_);
    uVar4 = (uint)sVar5 | 1;
    iVar1 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar7 = sVar7 + sVar5 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 2;
  }
  if (this->outputgateweightmatrix_ != (WeightParams *)0x0 &&
      this != (GRULayerParams *)&_GRULayerParams_default_instance_) {
    sVar5 = WeightParams::ByteSizeLong(this->outputgateweightmatrix_);
    uVar4 = (uint)sVar5 | 1;
    iVar1 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar7 = sVar7 + sVar5 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 2;
  }
  if (this->updategaterecursionmatrix_ != (WeightParams *)0x0 &&
      this != (GRULayerParams *)&_GRULayerParams_default_instance_) {
    sVar5 = WeightParams::ByteSizeLong(this->updategaterecursionmatrix_);
    uVar4 = (uint)sVar5 | 1;
    iVar1 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar7 = sVar7 + sVar5 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 2;
  }
  if (this->resetgaterecursionmatrix_ != (WeightParams *)0x0 &&
      this != (GRULayerParams *)&_GRULayerParams_default_instance_) {
    sVar5 = WeightParams::ByteSizeLong(this->resetgaterecursionmatrix_);
    uVar4 = (uint)sVar5 | 1;
    iVar1 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar7 = sVar7 + sVar5 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 2;
  }
  if (this->outputgaterecursionmatrix_ != (WeightParams *)0x0 &&
      this != (GRULayerParams *)&_GRULayerParams_default_instance_) {
    sVar5 = WeightParams::ByteSizeLong(this->outputgaterecursionmatrix_);
    uVar4 = (uint)sVar5 | 1;
    iVar1 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar7 = sVar7 + sVar5 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 2;
  }
  if (this->updategatebiasvector_ != (WeightParams *)0x0 &&
      this != (GRULayerParams *)&_GRULayerParams_default_instance_) {
    sVar5 = WeightParams::ByteSizeLong(this->updategatebiasvector_);
    uVar4 = (uint)sVar5 | 1;
    iVar1 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar7 = sVar7 + sVar5 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 2;
  }
  if (this->resetgatebiasvector_ != (WeightParams *)0x0 &&
      this != (GRULayerParams *)&_GRULayerParams_default_instance_) {
    sVar5 = WeightParams::ByteSizeLong(this->resetgatebiasvector_);
    uVar4 = (uint)sVar5 | 1;
    iVar1 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar7 = sVar7 + sVar5 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 2;
  }
  if (this->outputgatebiasvector_ != (WeightParams *)0x0 &&
      this != (GRULayerParams *)&_GRULayerParams_default_instance_) {
    sVar5 = WeightParams::ByteSizeLong(this->outputgatebiasvector_);
    uVar4 = (uint)sVar5 | 1;
    iVar1 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar7 = sVar7 + sVar5 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 2;
  }
  if (this->inputvectorsize_ != 0) {
    uVar6 = this->inputvectorsize_ | 1;
    lVar2 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    sVar7 = sVar7 + ((int)lVar2 * 9 + 0x49U >> 6) + 1;
  }
  if (this->outputvectorsize_ != 0) {
    uVar6 = this->outputvectorsize_ | 1;
    lVar2 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    sVar7 = sVar7 + ((int)lVar2 * 9 + 0x49U >> 6) + 1;
  }
  sVar5 = sVar7 + 2;
  if (this->sequenceoutput_ == false) {
    sVar5 = sVar7;
  }
  sVar7 = sVar5 + 3;
  if (this->hasbiasvectors_ == false) {
    sVar7 = sVar5;
  }
  sVar5 = sVar7 + 3;
  if (this->reverseinput_ == false) {
    sVar5 = sVar7;
  }
  this->_cached_size_ = (int)sVar5;
  return sVar5;
}

Assistant:

size_t GRULayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.GRULayerParams)
  size_t total_size = 0;

  // repeated .CoreML.Specification.ActivationParams activations = 10;
  {
    unsigned int count = this->activations_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->activations(i));
    }
  }

  // .CoreML.Specification.WeightParams updateGateWeightMatrix = 30;
  if (this->has_updategateweightmatrix()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->updategateweightmatrix_);
  }

  // .CoreML.Specification.WeightParams resetGateWeightMatrix = 31;
  if (this->has_resetgateweightmatrix()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->resetgateweightmatrix_);
  }

  // .CoreML.Specification.WeightParams outputGateWeightMatrix = 32;
  if (this->has_outputgateweightmatrix()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->outputgateweightmatrix_);
  }

  // .CoreML.Specification.WeightParams updateGateRecursionMatrix = 50;
  if (this->has_updategaterecursionmatrix()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->updategaterecursionmatrix_);
  }

  // .CoreML.Specification.WeightParams resetGateRecursionMatrix = 51;
  if (this->has_resetgaterecursionmatrix()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->resetgaterecursionmatrix_);
  }

  // .CoreML.Specification.WeightParams outputGateRecursionMatrix = 52;
  if (this->has_outputgaterecursionmatrix()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->outputgaterecursionmatrix_);
  }

  // .CoreML.Specification.WeightParams updateGateBiasVector = 70;
  if (this->has_updategatebiasvector()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->updategatebiasvector_);
  }

  // .CoreML.Specification.WeightParams resetGateBiasVector = 71;
  if (this->has_resetgatebiasvector()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->resetgatebiasvector_);
  }

  // .CoreML.Specification.WeightParams outputGateBiasVector = 72;
  if (this->has_outputgatebiasvector()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->outputgatebiasvector_);
  }

  // uint64 inputVectorSize = 1;
  if (this->inputvectorsize() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->inputvectorsize());
  }

  // uint64 outputVectorSize = 2;
  if (this->outputvectorsize() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->outputvectorsize());
  }

  // bool sequenceOutput = 15;
  if (this->sequenceoutput() != 0) {
    total_size += 1 + 1;
  }

  // bool hasBiasVectors = 20;
  if (this->hasbiasvectors() != 0) {
    total_size += 2 + 1;
  }

  // bool reverseInput = 100;
  if (this->reverseinput() != 0) {
    total_size += 2 + 1;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}